

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::ApproximateBestSubset::test_method(ApproximateBestSubset *this)

{
  long lVar1;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar2;
  int iVar3;
  FastRandomContext *rng;
  iterator pvVar4;
  iterator pvVar5;
  assertion_result *paVar6;
  long in_FS_OFFSET;
  bool bVar7;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  check_type cVar9;
  long in_stack_fffffffffffffd90;
  uint uVar8;
  undefined8 in_stack_fffffffffffffd98;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  lazy_ostream local_1e0;
  undefined1 *local_1d0;
  char **local_1c8;
  assertion_result local_1c0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  optional<wallet::SelectionResult> result;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rand,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)&available_coins);
  NewWallet((NodeContext *)&wallet,
            (string *)
            &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node);
  std::__cxx11::string::~string((string *)&result);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  iVar3 = 1000;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    bVar7 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    uVar8 = (uint)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    if (bVar7) break;
    result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
    super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
    super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 100000000000;
    in_stack_fffffffffffffd90 = (ulong)uVar8 << 0x20;
    add_coin(&available_coins,
             (CWallet *)
             wallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result,
             (CFeeRate)0x0,0x90,false,0,false,(int)in_stack_fffffffffffffd98);
  }
  result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
  super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
  super__Optional_payload_base<wallet::SelectionResult>._M_payload._0_8_ = 300000000;
  _cVar9 = (check_type)((ulong)uVar8 << 0x20);
  pvVar4 = (iterator)0x0;
  add_coin(&available_coins,
           (CWallet *)
           wallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
           ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
           super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&result,
           (CFeeRate)0x0,0x90,false,0,false,(int)in_stack_fffffffffffffd98);
  groups = KnapsackGroupOutputs
                     (&available_coins,
                      (CWallet *)
                      wallet._M_t.
                      super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                      .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                      (CoinEligibilityFilter *)filter_standard);
  local_1e0._vptr_lazy_ostream = (_func_int **)0x175a588b00;
  rng = &rand;
  KnapsackSolver(&result,groups,(CAmount *)&local_1e0,1000000,rng);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar4;
  msg.m_begin = (iterator)rng;
  file.m_end = (iterator)0x331;
  file.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       result.super__Optional_base<wallet::SelectionResult,_false,_false>._M_payload.
       super__Optional_payload<wallet::SelectionResult,_true,_false,_false>.
       super__Optional_payload_base<wallet::SelectionResult>._M_engaged;
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "result";
  local_1e8 = "";
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_1c8 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,&local_1e0,1,0,WARN,_cVar9,(size_t)&local_200,0x331);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x332;
  file_00.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_220,
             msg_00);
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = (char **)0xc694e1;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_228 = "";
  local_1c0._0_8_ = SelectionResult::GetSelectedValue((SelectionResult *)&result);
  paVar6 = &local_1c0;
  local_1f0 = (char *)0x175a588b00;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_1e0,&local_230,0x332,1,2,paVar6,"result->GetSelectedValue()",&local_1f0,
             "1003 * COIN");
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)paVar6;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x333;
  file_01.m_begin = (iterator)&local_240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_250,
             msg_01);
  local_1e0.m_empty = false;
  local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_1d0 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = (char **)0xc694e1;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_258 = "";
  psVar2 = SelectionResult::GetInputSet((SelectionResult *)&result);
  local_1c0._0_8_ = (psVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1f0 = (char *)CONCAT44(local_1f0._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_1e0,&local_260,0x333,1,2,&local_1c0,"result->GetInputSet().size()",&local_1f0,
             "2U");
  std::_Optional_payload_base<wallet::SelectionResult>::_M_reset
            ((_Optional_payload_base<wallet::SelectionResult> *)&result);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  ChaCha20::~ChaCha20(&rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ApproximateBestSubset)
{
    FastRandomContext rand{};
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;

    // Test vValue sort order
    for (int i = 0; i < 1000; i++)
        add_coin(available_coins, *wallet, 1000 * COIN);
    add_coin(available_coins, *wallet, 3 * COIN);

    const auto result = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1003 * COIN, CENT, rand);
    BOOST_CHECK(result);
    BOOST_CHECK_EQUAL(result->GetSelectedValue(), 1003 * COIN);
    BOOST_CHECK_EQUAL(result->GetInputSet().size(), 2U);
}